

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O2

optional<pbrt::BSDFSample> * __thiscall
pbrt::DielectricInterfaceBxDF::Sample_f
          (optional<pbrt::BSDFSample> *__return_storage_ptr__,DielectricInterfaceBxDF *this,
          Vector3f wo,Float uc,Point2f u,TransportMode mode,BxDFReflTransFlags sampleFlags)

{
  TrowbridgeReitzDistribution *this_00;
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  int iVar6;
  undefined8 uVar7;
  long in_FS_OFFSET;
  undefined1 auVar8 [16];
  Float FVar9;
  Float FVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [16];
  undefined1 auVar27 [64];
  undefined1 auVar35 [56];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar34 [60];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  float fVar36;
  float fVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  Vector3f VVar40;
  Vector3<float> VVar41;
  Vector3f wo_00;
  Normal3<float> n;
  Vector3f wi;
  Vector3f wo_01;
  SampledSpectrum SVar42;
  Tuple3<pbrt::Vector3,_float> local_c8;
  undefined1 local_b8 [16];
  Tuple3<pbrt::Vector3,_float> local_a8;
  SampledSpectrum local_98;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  SampledSpectrum ft;
  undefined1 auVar18 [64];
  undefined1 extraout_var [60];
  
  local_98.values.values[3] = local_98.values.values[1];
  auVar27._4_60_ = wo._12_60_;
  auVar27._0_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar15._8_56_ = wo._8_56_;
  auVar15._0_8_ = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_68 = auVar15._0_16_;
  local_c8._0_8_ = vmovlps_avx(local_68);
  local_b8._0_4_ = uc;
  auVar8 = vminss_avx(ZEXT416((uint)(this->mfDistrib).alpha_y),
                      ZEXT416((uint)(this->mfDistrib).alpha_x));
  local_c8.z = auVar27._0_4_;
  if (0.001 <= auVar8._0_4_) {
    this_00 = &this->mfDistrib;
    auVar34 = ZEXT1260(wo._12_12_);
    VVar40 = TrowbridgeReitzDistribution::Sample_wm(this_00,wo,u);
    auVar18._0_8_ = VVar40.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar18._8_56_ = auVar15._8_56_;
    uVar7 = vmovlps_avx(auVar18._0_16_);
    local_98.values.values[2] = VVar40.super_Tuple3<pbrt::Vector3,_float>.z;
    local_98.values.values[0] = (float)(int)uVar7;
    local_98.values.values[1] = (float)(int)((ulong)uVar7 >> 0x20);
    VVar40 = Reflect((Vector3f *)&local_c8,(Vector3f *)&local_98);
    local_78._0_4_ = VVar40.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar19._0_8_ = VVar40.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar19._8_56_ = auVar15._8_56_;
    local_68 = auVar19._0_16_;
    ft.values.values._0_12_ = ZEXT412(0x3f800000) << 0x40;
    VVar41 = FaceForward<float>((Vector3<float> *)&local_98,(Vector3<float> *)&ft);
    auVar30._0_4_ = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar30._4_60_ = auVar34;
    auVar20._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar20._8_56_ = auVar15._8_56_;
    auVar38._0_4_ = local_68._0_4_ * VVar41.super_Tuple3<pbrt::Vector3,_float>.x;
    auVar38._4_4_ = local_68._4_4_ * VVar41.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar38._8_4_ = local_68._8_4_ * auVar15._8_4_;
    auVar38._12_4_ = local_68._12_4_ * auVar15._12_4_;
    auVar8 = vmovshdup_avx(auVar38);
    auVar8 = vfmadd231ss_fma(auVar8,local_68,auVar20._0_16_);
    auVar8 = vfmadd231ss_fma(auVar8,auVar30._0_16_,ZEXT416((uint)local_78._0_4_));
    auVar21._0_4_ = FrDielectric(auVar8._0_4_,this->eta);
    auVar21._4_60_ = extraout_var;
    auVar15._8_56_ = extraout_var._4_56_;
    fVar37 = (float)((uint)((byte)sampleFlags & 1) * (int)auVar21._0_4_);
    auVar8._4_12_ = extraout_var._0_12_;
    auVar8._0_4_ = fVar37;
    local_88 = ZEXT416((uint)(1.0 - auVar21._0_4_));
    fVar11 = (float)((uint)((sampleFlags & Transmission) != Unset) * (int)(1.0 - auVar21._0_4_));
    local_68 = ZEXT416((uint)fVar11);
    if (((fVar37 == 0.0) && (fVar11 == 0.0)) && (!NAN(fVar11))) {
LAB_0036f6ec:
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
      *(undefined8 *)&__return_storage_ptr__->optionalValue = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
      return __return_storage_ptr__;
    }
    local_78._0_4_ = fVar37 + fVar11;
    if (fVar37 / (fVar37 + fVar11) <= (float)local_b8._0_4_) {
      local_a8.x = 0.0;
      local_a8.y = 0.0;
      local_a8.z = 0.0;
      uVar7 = vcmpss_avx512f(ZEXT416(0) << 0x20,ZEXT416((uint)local_c8.z),1);
      bVar5 = (bool)((byte)uVar7 & 1);
      FVar9 = (Float)((uint)bVar5 * (int)this->eta + (uint)!bVar5 * (int)(1.0 / this->eta));
      local_b8 = ZEXT416((uint)FVar9);
      VVar40.super_Tuple3<pbrt::Vector3,_float>.z = local_c8.z;
      VVar40.super_Tuple3<pbrt::Vector3,_float>.x = local_c8.x;
      VVar40.super_Tuple3<pbrt::Vector3,_float>.y = local_c8.y;
      bVar5 = Refract(VVar40,(Normal3f)local_98.values.values._0_12_,FVar9,(Vector3f *)&local_a8);
      if (Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
          ::reg == '\0') {
        iVar6 = __cxa_guard_acquire(&Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                     ::reg);
        if (iVar6 != 0) {
          StatRegisterer::StatRegisterer
                    ((StatRegisterer *)
                     &Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                      ::reg,Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                            ::StatsAccumulator__,(PixelAccumFunc)0x0);
          __cxa_guard_release(&Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                               ::reg);
        }
      }
      *(long *)(in_FS_OFFSET + -0x508) = *(long *)(in_FS_OFFSET + -0x508) + 1;
      if (!bVar5) {
        *(long *)(in_FS_OFFSET + -0x510) = *(long *)(in_FS_OFFSET + -0x510) + 1;
      }
      auVar15._8_56_ = (undefined1  [56])0x0;
      auVar34 = ZEXT1260(SUB1612(ZEXT816(0) << 0x40,4));
      if ((local_a8.z * local_c8.z <= 0.0) && (bVar5 && local_a8.z != 0.0)) {
        ft.values.values._0_12_ = ZEXT412(0x3f800000) << 0x40;
        VVar41 = FaceForward<float>((Vector3<float> *)&local_98,(Normal3<float> *)&ft);
        auVar33._0_4_ = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar33._4_60_ = auVar34;
        auVar25._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar25._8_56_ = auVar15._8_56_;
        auVar14 = auVar25._0_16_;
        auVar8 = vmovshdup_avx(auVar14);
        uVar7 = vmovlps_avx(auVar14);
        local_98.values.values[2] = auVar33._0_4_;
        local_98.values.values[0] = (float)(int)uVar7;
        local_98.values.values[1] = (float)(int)((ulong)uVar7 >> 0x20);
        auVar38 = vfmadd231ss_fma(ZEXT416((uint)(auVar8._0_4_ * local_c8.y)),auVar14,
                                  ZEXT416((uint)local_c8.x));
        auVar8 = vfmadd231ss_fma(ZEXT416((uint)(auVar8._0_4_ * local_a8.y)),auVar14,
                                 ZEXT416((uint)local_a8.x));
        auVar38 = vfmadd231ss_fma(auVar38,auVar33._0_16_,ZEXT416((uint)local_c8.z));
        auVar8 = vfmadd231ss_fma(auVar8,auVar33._0_16_,ZEXT416((uint)local_a8.z));
        fVar37 = 1.0 / local_b8._0_4_;
        auVar38 = vfmadd213ss_fma(auVar8,local_b8,auVar38);
        local_88._0_4_ =
             (float)((uint)(mode == Radiance) * (int)(fVar37 * fVar37) +
                    (uint)(mode != Radiance) * 0x3f800000) * (float)local_88._0_4_;
        FVar9 = TrowbridgeReitzDistribution::D(this_00,(Vector3f *)&local_98);
        FVar10 = TrowbridgeReitzDistribution::G(this_00,(Vector3f *)&local_c8,(Vector3f *)&local_a8)
        ;
        fVar37 = AbsDot<float>((Vector3<float> *)&local_a8,(Vector3<float> *)&local_98);
        fVar11 = AbsDot<float>((Vector3<float> *)&local_c8,(Vector3<float> *)&local_98);
        auVar39._8_4_ = 0x7fffffff;
        auVar39._0_8_ = 0x7fffffff7fffffff;
        auVar39._12_4_ = 0x7fffffff;
        auVar8 = vandps_avx(ZEXT416((uint)(local_a8.z * local_c8.z)),auVar39);
        auVar14._0_4_ =
             (fVar11 * fVar37 * FVar10 * FVar9) / (auVar38._0_4_ * auVar38._0_4_ * auVar8._0_4_);
        auVar14._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar8 = vandps_avx(auVar14,auVar39);
        SampledSpectrum::SampledSpectrum(&ft,auVar8._0_4_ * (float)local_88._0_4_);
        fVar37 = AbsDot<float>((Vector3<float> *)&local_a8,(Vector3<float> *)&local_98);
        auVar8 = vfmadd231ss_fma(ZEXT416((uint)(local_98.values.values[1] * local_c8.y)),
                                 ZEXT416((uint)local_98.values.values[0]),ZEXT416((uint)local_c8.x))
        ;
        auVar38 = vfmadd231ss_fma(ZEXT416((uint)(local_98.values.values[1] * local_a8.y)),
                                  ZEXT416((uint)local_98.values.values[0]),ZEXT416((uint)local_a8.x)
                                 );
        auVar38 = vfmadd231ss_fma(auVar38,ZEXT416((uint)local_98.values.values[2]),
                                  ZEXT416((uint)local_a8.z));
        auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)local_c8.z),
                                 ZEXT416((uint)local_98.values.values[2]));
        auVar8 = vfmadd132ss_fma(auVar38,auVar8,ZEXT416((uint)local_b8._0_4_));
        local_88._0_4_ = fVar37 / (auVar8._0_4_ * auVar8._0_4_);
        wo_01.super_Tuple3<pbrt::Vector3,_float>.z = local_c8.z;
        wo_01.super_Tuple3<pbrt::Vector3,_float>.x = local_c8.x;
        wo_01.super_Tuple3<pbrt::Vector3,_float>.y = local_c8.y;
        FVar9 = TrowbridgeReitzDistribution::PDF
                          (this_00,wo_01,(Vector3f)local_98.values.values._0_12_);
        fVar37 = (FVar9 * (float)local_88._0_4_ * (float)local_68._0_4_) / (float)local_78._0_4_;
        if (NAN(fVar37)) {
          LogFatal<char_const(&)[12]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/bxdfs.cpp"
                     ,0xe3,"Check failed: %s",(char (*) [12])"!IsNaN(pdf)");
        }
        __return_storage_ptr__->set = true;
        *(undefined8 *)&__return_storage_ptr__->optionalValue = ft.values.values._0_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = ft.values.values._8_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = local_a8._0_8_;
        *(float *)((long)&__return_storage_ptr__->optionalValue + 0x18) = local_a8.z;
        *(float *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = fVar37;
        *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 10;
        *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x24) = local_b8._0_4_;
        goto LAB_0036fd12;
      }
      goto LAB_0036f6ec;
    }
    local_b8 = auVar8;
    local_68 = auVar21._0_16_;
    VVar40 = Reflect((Vector3f *)&local_c8,(Vector3f *)&local_98);
    local_a8.z = VVar40.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar22._0_8_ = VVar40.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar22._8_56_ = auVar15._8_56_;
    local_a8._0_8_ = vmovlps_avx(auVar22._0_16_);
    if ((Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
         ::reg == '\0') &&
       (iVar6 = __cxa_guard_acquire(&Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                     ::reg), iVar6 != 0)) {
      StatRegisterer::StatRegisterer
                ((StatRegisterer *)
                 &Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                  ::reg,Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                        ::StatsAccumulator__,(PixelAccumFunc)0x0);
      __cxa_guard_release(&Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                           ::reg);
    }
    *(long *)(in_FS_OFFSET + -0x518) = *(long *)(in_FS_OFFSET + -0x518) + 1;
    auVar8 = vfmadd231ss_fma(ZEXT416((uint)(local_c8.y * local_98.values.values[1])),
                             ZEXT416((uint)local_c8.x),ZEXT416((uint)local_98.values.values[0]));
    auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)local_c8.z),
                             ZEXT416((uint)local_98.values.values[2]));
    if (auVar8._0_4_ <= 0.0) {
      *(long *)(in_FS_OFFSET + -0x520) = *(long *)(in_FS_OFFSET + -0x520) + 1;
      goto LAB_0036f6ec;
    }
    if (local_c8.z * local_a8.z <= 0.0) goto LAB_0036f6ec;
    local_88 = ZEXT416((uint)local_a8.z);
    wo_00.super_Tuple3<pbrt::Vector3,_float>.z = local_c8.z;
    wo_00.super_Tuple3<pbrt::Vector3,_float>.x = local_c8.x;
    wo_00.super_Tuple3<pbrt::Vector3,_float>.y = local_c8.y;
    FVar9 = TrowbridgeReitzDistribution::PDF(this_00,wo_00,(Vector3f)local_98.values.values._0_12_);
    auVar8 = vfmadd231ss_fma(ZEXT416((uint)(local_c8.y * local_98.values.values[1])),
                             ZEXT416((uint)local_c8.x),ZEXT416((uint)local_98.values.values[0]));
    auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)local_c8.z),
                             ZEXT416((uint)local_98.values.values[2]));
    fVar37 = ((FVar9 / (auVar8._0_4_ * 4.0)) * (float)local_b8._0_4_) / (float)local_78._0_4_;
    if (NAN(fVar37)) {
      LogFatal<char_const(&)[12]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/bxdfs.cpp"
                 ,0xbf,"Check failed: %s",(char (*) [12])"!IsNaN(pdf)");
    }
    if (((local_c8.z == 0.0) && (!NAN(local_c8.z))) ||
       ((local_88._0_4_ == 0.0 && (!NAN(local_88._0_4_))))) goto LAB_0036f6ec;
    auVar12._8_4_ = 0x7fffffff;
    auVar12._0_8_ = 0x7fffffff7fffffff;
    auVar12._12_4_ = 0x7fffffff;
    local_b8._0_4_ = fVar37;
    local_78 = vandps_avx(ZEXT416((uint)local_c8.z),auVar12);
    local_88 = vandps_avx(local_88,auVar12);
    FVar9 = TrowbridgeReitzDistribution::D(this_00,(Vector3f *)&local_98);
    FVar10 = TrowbridgeReitzDistribution::G(this_00,(Vector3f *)&local_c8,(Vector3f *)&local_a8);
    SampledSpectrum::SampledSpectrum
              (&ft,(FVar10 * FVar9 * (float)local_68._0_4_) /
                   ((float)local_88._0_4_ * 4.0 * (float)local_78._0_4_));
    __return_storage_ptr__->set = true;
    uVar7 = 0x3f80000000000009;
    *(undefined8 *)&__return_storage_ptr__->optionalValue = ft.values.values._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = ft.values.values._8_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = local_a8._0_8_;
    *(float *)((long)&__return_storage_ptr__->optionalValue + 0x18) = local_a8.z;
    local_68._0_4_ = local_b8._0_4_;
  }
  else {
    local_78 = auVar27._0_16_;
    FVar9 = FrDielectric(auVar27._0_4_,this->eta);
    auVar8 = local_68;
    fVar37 = (float)((uint)((byte)sampleFlags & 1) * (int)FVar9);
    local_88 = ZEXT416((uint)(1.0 - FVar9));
    fVar11 = (float)((uint)((sampleFlags & Transmission) != Unset) * (int)(1.0 - FVar9));
    if (((fVar37 == 0.0) && (fVar11 == 0.0)) && (!NAN(fVar11))) goto LAB_0036f6ec;
    fVar36 = fVar37 / (fVar37 + fVar11);
    if (fVar36 <= (float)local_b8._0_4_) {
      local_a8.x = 0.0;
      local_a8.y = 0.0;
      local_a8.z = 0.0;
      ft.values.values._0_12_ = ZEXT412(0x3f800000) << 0x40;
      uVar7 = vcmpss_avx512f(ZEXT816(0),ZEXT416((uint)local_78._0_4_),1);
      bVar5 = (bool)((byte)uVar7 & 1);
      local_b8 = ZEXT416((uint)bVar5 * (int)this->eta + (uint)!bVar5 * (int)(1.0 / this->eta));
      n = FaceForward<float>((Normal3<float> *)&ft,(Vector3<float> *)&local_c8);
      auVar8 = local_68;
      wi.super_Tuple3<pbrt::Vector3,_float>.z = local_78._0_4_;
      wi.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_68._0_4_;
      wi.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_68._4_4_;
      auVar15._8_56_ = ZEXT856((ulong)local_78._8_8_);
      local_68 = auVar8;
      bVar5 = Refract(wi,(Normal3f)n.super_Tuple3<pbrt::Normal3,_float>,(Float)local_b8._0_4_,
                      (Vector3f *)&local_a8);
      if ((Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
           ::reg == '\0') &&
         (iVar6 = __cxa_guard_acquire(&Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                       ::reg), auVar15._8_56_ = extraout_var_01, iVar6 != 0)) {
        StatRegisterer::StatRegisterer
                  ((StatRegisterer *)
                   &Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                    ::reg,Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                          ::StatsAccumulator__,(PixelAccumFunc)0x0);
        __cxa_guard_release(&Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                             ::reg);
        auVar15._8_56_ = extraout_var_02;
      }
      *(long *)(in_FS_OFFSET + -0x528) = *(long *)(in_FS_OFFSET + -0x528) + 1;
      if (!bVar5) {
        *(long *)(in_FS_OFFSET + -0x530) = *(long *)(in_FS_OFFSET + -0x530) + 1;
        goto LAB_0036f6ec;
      }
      auVar35 = ZEXT856((ulong)local_88._8_8_);
      SVar42 = SampledSpectrum::operator*(&this->tint,local_88._0_4_);
      auVar31._0_8_ = SVar42.values.values._8_8_;
      auVar31._8_56_ = auVar15._8_56_;
      auVar23._0_8_ = SVar42.values.values._0_8_;
      auVar23._8_56_ = auVar35;
      local_98.values.values = (array<float,_4>)vmovlhps_avx(auVar23._0_16_,auVar31._0_16_);
      auVar4._8_4_ = 0x7fffffff;
      auVar4._0_8_ = 0x7fffffff7fffffff;
      auVar4._12_4_ = 0x7fffffff;
      auVar8 = vandps_avx512vl(ZEXT416((uint)local_a8.z),auVar4);
      auVar35 = ZEXT856(auVar8._8_8_);
      SVar42 = SampledSpectrum::operator/(&local_98,auVar8._0_4_);
      auVar32._0_8_ = SVar42.values.values._8_8_;
      auVar32._8_56_ = auVar15._8_56_;
      auVar24._0_8_ = SVar42.values.values._0_8_;
      auVar24._8_56_ = auVar35;
      auVar13 = auVar24._0_16_;
      auVar26 = auVar32._0_16_;
      ft.values.values = (array<float,_4>)vmovlhps_avx(auVar13,auVar26);
      if (mode == Radiance) {
        SampledSpectrum::operator/=(&ft,(float)local_b8._0_4_ * (float)local_b8._0_4_);
        SVar42.values.values = ft.values.values;
        auVar13._8_8_ = 0;
        auVar13._0_4_ = ft.values.values[0];
        auVar13._4_4_ = ft.values.values[1];
        ft.values.values._8_8_ = SVar42.values.values._8_8_;
        auVar26._8_8_ = 0;
        auVar26._0_4_ = ft.values.values[2];
        auVar26._4_4_ = ft.values.values[3];
      }
      auVar8 = vmovlhps_avx(auVar13,auVar26);
      __return_storage_ptr__->set = true;
      *(undefined1 (*) [16])&__return_storage_ptr__->optionalValue = auVar8;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = local_a8._0_8_;
      *(float *)((long)&__return_storage_ptr__->optionalValue + 0x18) = local_a8.z;
      *(float *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = fVar11 / (fVar37 + fVar11);
      *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0x12;
      *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x24) = local_b8._0_4_;
      goto LAB_0036fd12;
    }
    local_68._0_4_ = fVar36;
    auVar2._8_4_ = 0x80000000;
    auVar2._0_8_ = 0x8000000080000000;
    auVar2._12_4_ = 0x80000000;
    local_b8 = vxorps_avx512vl(auVar8,auVar2);
    auVar35 = ZEXT856(local_b8._8_8_);
    auVar15._8_56_ = extraout_var_00;
    SVar42 = SampledSpectrum::operator*(&this->tint,FVar9);
    auVar28._0_8_ = SVar42.values.values._8_8_;
    auVar28._8_56_ = auVar35;
    auVar16._0_8_ = SVar42.values.values._0_8_;
    auVar16._8_56_ = auVar15._8_56_;
    ft.values.values = (array<float,_4>)vmovlhps_avx(auVar16._0_16_,auVar28._0_16_);
    auVar3._8_4_ = 0x7fffffff;
    auVar3._0_8_ = 0x7fffffff7fffffff;
    auVar3._12_4_ = 0x7fffffff;
    auVar8 = vandps_avx512vl(local_78,auVar3);
    auVar15._8_56_ = ZEXT856(auVar8._8_8_);
    SVar42 = SampledSpectrum::operator/(&ft,auVar8._0_4_);
    auVar29._0_8_ = SVar42.values.values._8_8_;
    auVar29._8_56_ = auVar35;
    auVar17._0_8_ = SVar42.values.values._0_8_;
    auVar17._8_56_ = auVar15._8_56_;
    auVar8 = vmovlhps_avx(auVar17._0_16_,auVar29._0_16_);
    __return_storage_ptr__->set = true;
    uVar7 = 0x3f80000000000011;
    *(undefined1 (*) [16])&__return_storage_ptr__->optionalValue = auVar8;
    uVar1 = vmovlps_avx(local_b8);
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = uVar1;
    *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = local_78._0_4_;
  }
  *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = local_68._0_4_;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = uVar7;
LAB_0036fd12:
  (__return_storage_ptr__->optionalValue).__data[0x28] = '\0';
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<BSDFSample> DielectricInterfaceBxDF::Sample_f(
    Vector3f wo, Float uc, Point2f u, TransportMode mode,
    BxDFReflTransFlags sampleFlags) const {
    if (mfDistrib.EffectivelySmooth()) {
        // Sample delta dielectric interface
        Float R = FrDielectric(CosTheta(wo), eta), T = 1 - R;
        // Compute probabilities _pr_ and _pt_ for sampling reflection and transmission
        Float pr = R, pt = T;
        if (!(sampleFlags & BxDFReflTransFlags::Reflection))
            pr = 0;
        if (!(sampleFlags & BxDFReflTransFlags::Transmission))
            pt = 0;
        if (pr == 0 && pt == 0)
            return {};

        if (uc < pr / (pr + pt)) {
            // Sample perfect specular reflection at interface
            Vector3f wi(-wo.x, -wo.y, wo.z);
            SampledSpectrum fr(tint * R / AbsCosTheta(wi));
            return BSDFSample(fr, wi, pr / (pr + pt), BxDFFlags::SpecularReflection);

        } else {
            // Sample perfect specular transmission at interface
            // Figure out which $\eta$ is incident and which is transmitted
            bool entering = CosTheta(wo) > 0;
            Float etap = entering ? eta : (1 / eta);

            // Compute ray direction for specular transmission
            Vector3f wi;
            bool tir = !Refract(wo, FaceForward(Normal3f(0, 0, 1), wo), etap, &wi);
            CHECK_RARE(1e-5f, tir);
            if (tir)
                return {};

            SampledSpectrum ft(tint * T / AbsCosTheta(wi));
            // Account for non-symmetry with transmission to different medium
            if (mode == TransportMode::Radiance)
                ft /= Sqr(etap);

            return BSDFSample(ft, wi, pt / (pr + pt), BxDFFlags::SpecularTransmission,
                              etap);
        }

    } else {
        // Sample non-delta dielectric interface
        // Sample half-angle vector for outgoing direction and compute Frensel factor
        Vector3f wh = mfDistrib.Sample_wm(wo, u);
        Float F =
            FrDielectric(Dot(Reflect(wo, wh), FaceForward(wh, Vector3f(0, 0, 1))), eta);
        Float R = F, T = 1 - R;

        // Compute probabilities _pr_ and _pt_ for sampling reflection and transmission
        Float pr = R, pt = T;
        if (!(sampleFlags & BxDFReflTransFlags::Reflection))
            pr = 0;
        if (!(sampleFlags & BxDFReflTransFlags::Transmission))
            pt = 0;
        if (pr == 0 && pt == 0)
            return {};

        if (uc < pr / (pr + pt)) {
            // Sample reflection at non-delta dielectric interface
            Vector3f wi = Reflect(wo, wh);
            CHECK_RARE(1e-5f, Dot(wo, wh) <= 0);
            if (!SameHemisphere(wo, wi) || Dot(wo, wh) <= 0)
                return {};
            // Compute PDF of direction $\wi$ for microfacet reflection
            Float pdf = mfDistrib.PDF(wo, wh) / (4 * Dot(wo, wh)) * pr / (pr + pt);
            CHECK(!IsNaN(pdf));

            // Evaluate BRDF and return _BSDFSample_ for dielectric microfacet reflection
            Float cosTheta_o = AbsCosTheta(wo), cosTheta_i = AbsCosTheta(wi);
            if (cosTheta_i == 0 || cosTheta_o == 0)
                return {};
            SampledSpectrum f(mfDistrib.D(wh) * mfDistrib.G(wo, wi) * F /
                              (4 * cosTheta_i * cosTheta_o));
            return BSDFSample(f, wi, pdf, BxDFFlags::GlossyReflection);

        } else {
            // Sample transmission at non-delta dielectric interface
            Float etap = CosTheta(wo) > 0 ? eta : (1 / eta);
            Vector3f wi;
            bool tir = !Refract(wo, (Normal3f)wh, etap, &wi);
            CHECK_RARE(1e-5f, tir);
            if (SameHemisphere(wo, wi))
                return {};
            if (tir || wi.z == 0)
                return {};

            // Evaluate BSDF
            wh = FaceForward(wh, Normal3f(0, 0, 1));

            Float sqrtDenom = Dot(wo, wh) + etap * Dot(wi, wh);
            Float factor = (mode == TransportMode::Radiance) ? Sqr(1 / etap) : 1;

            SampledSpectrum f(
                (1 - F) * factor *
                std::abs(mfDistrib.D(wh) * mfDistrib.G(wo, wi) * AbsDot(wi, wh) *
                         AbsDot(wo, wh) /
                         (AbsCosTheta(wi) * AbsCosTheta(wo) * Sqr(sqrtDenom))));

            Float dwh_dwi =
                /*Sqr(etap) * */ AbsDot(wi, wh) / Sqr(Dot(wo, wh) + etap * Dot(wi, wh));
            Float pdf = mfDistrib.PDF(wo, wh) * dwh_dwi * pt / (pr + pt);
            CHECK(!IsNaN(pdf));

            return BSDFSample(f, wi, pdf, BxDFFlags::GlossyTransmission, etap);
        }
    }
}